

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<>(ArenaStringPtr *this,Arena *arena)

{
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((undefined8 *)(this->tagged_ptr_).ptr_ != &fixed_address_empty_string_abi_cxx11_) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0x9b);
    other = LogMessage::operator<<(&local_58,"CHECK failed: IsDefault(default_value): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  pbVar1 = Arena::Create<std::__cxx11::string>(arena);
  (this->tagged_ptr_).ptr_ = pbVar1;
  return pbVar1;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}